

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O2

AnimationCurveMap * __thiscall
Assimp::FBX::AnimationCurveNode::Curves_abi_cxx11_(AnimationCurveNode *this)

{
  Connection *this_00;
  Object *pOVar1;
  mapped_type pAVar2;
  mapped_type *ppAVar3;
  pointer ppCVar4;
  allocator local_71;
  AnimationCurveMap *local_70;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_68;
  string local_50;
  
  local_70 = &this->curves;
  if ((this->curves)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    Document::GetConnectionsByDestinationSequenced
              ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                *)&local_68,this->doc,(this->super_Object).id,"AnimationCurve");
    for (ppCVar4 = local_68._M_impl.super__Vector_impl_data._M_start;
        ppCVar4 != local_68._M_impl.super__Vector_impl_data._M_finish; ppCVar4 = ppCVar4 + 1) {
      this_00 = *ppCVar4;
      if ((this_00->prop)._M_string_length != 0) {
        pOVar1 = Connection::SourceObject(this_00);
        if (pOVar1 == (Object *)0x0) {
          std::__cxx11::string::string
                    ((string *)&local_50,
                     "failed to read source object for AnimationCurve->AnimationCurveNode link, ignoring"
                     ,&local_71);
          Util::DOMWarning(&local_50,(this->super_Object).element);
        }
        else {
          pAVar2 = (mapped_type)__dynamic_cast(pOVar1,&Object::typeinfo,&AnimationCurve::typeinfo,0)
          ;
          if (pAVar2 != (mapped_type)0x0) {
            ppAVar3 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
                      ::operator[](local_70,&this_00->prop);
            *ppAVar3 = pAVar2;
            goto LAB_00177704;
          }
          std::__cxx11::string::string
                    ((string *)&local_50,
                     "source object for ->AnimationCurveNode link is not an AnimationCurve",
                     &local_71);
          Util::DOMWarning(&local_50,(this->super_Object).element);
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
LAB_00177704:
    }
    std::
    _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
    ::~_Vector_base(&local_68);
  }
  return local_70;
}

Assistant:

const AnimationCurveMap& AnimationCurveNode::Curves() const
{
    if ( curves.empty() ) {
        // resolve attached animation curves
        const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"AnimationCurve");

        for(const Connection* con : conns) {

            // link should go for a property
            if (!con->PropertyName().length()) {
                continue;
            }

            const Object* const ob = con->SourceObject();
            if(!ob) {
                DOMWarning("failed to read source object for AnimationCurve->AnimationCurveNode link, ignoring",&element);
                continue;
            }

            const AnimationCurve* const anim = dynamic_cast<const AnimationCurve*>(ob);
            if(!anim) {
                DOMWarning("source object for ->AnimationCurveNode link is not an AnimationCurve",&element);
                continue;
            }

            curves[con->PropertyName()] = anim;
        }
    }

    return curves;
}